

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

chunk_conflict * hard_centre_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  ushort uVar1;
  loc_conflict to_avoid;
  bool bVar2;
  wchar_t wVar3;
  _Bool _Var4;
  int16_t iVar5;
  uint32_t uVar6;
  int iVar7;
  wchar_t wVar8;
  wchar_t w;
  wchar_t w_00;
  wchar_t wVar9;
  uint32_t uVar10;
  chunk *c_00;
  chunk_conflict *source;
  chunk_conflict *source_00;
  chunk_conflict *source_01;
  chunk_conflict *source_02;
  loc lVar11;
  loc lVar12;
  int local_154;
  int local_150;
  int local_14c;
  int local_10c;
  loc_conflict local_b8;
  loc floor [4];
  wchar_t wStack_90;
  loc grid;
  wchar_t cavern_area;
  wchar_t k;
  wchar_t i;
  chunk_conflict *c;
  chunk_conflict *right_cavern;
  chunk_conflict *left_cavern;
  wchar_t right_cavern_wid;
  wchar_t left_cavern_wid;
  wchar_t lower_cavern_ypos;
  chunk_conflict *lower_cavern;
  chunk_conflict *upper_cavern;
  wchar_t lower_cavern_hgt;
  wchar_t upper_cavern_hgt;
  wchar_t centre_cavern_wid;
  wchar_t centre_cavern_hgt;
  wchar_t centre_cavern_ypos;
  wchar_t rotate;
  chunk_conflict *centre;
  char **p_error_local;
  wchar_t min_width_local;
  wchar_t min_height_local;
  player *p_local;
  
  c_00 = (chunk *)vault_chunk(p);
  if ((dun->persist & 1U) == 0) {
    if (*dun->ent_n < 1) {
      local_10c = 0;
    }
    else {
      uVar6 = Rand_div(3);
      local_10c = uVar6 + 1;
    }
    dun->wall_n = L'\0';
    for (cavern_area = L'\0'; cavern_area < local_10c + L'\x01'; cavern_area = cavern_area + L'\x01'
        ) {
      if (*dun->ent_n == 0) {
        _Var4 = cave_find((chunk_conflict *)c_00,(loc *)&floor[3].y,square_iswall_outer);
        if (!_Var4) {
          if (cavern_area == L'\0') {
            uncreate_artifacts((chunk_conflict *)c_00);
            wipe_mon_list(c_00,p);
            cave_free((chunk_conflict *)c_00);
            *p_error = "no SQUARE_WALL_OUTER grid for an entrance to the centre vault";
            return (chunk_conflict *)0x0;
          }
          break;
        }
      }
      else {
        register0x00000000 =
             (loc_conflict)
             choose_random_entrance
                       ((chunk_conflict *)c_00,L'\0',(loc *)0x0,L'\0',(loc *)dun->wall,cavern_area);
        lVar11 = loc(0,0);
        _Var4 = loc_eq((loc)stack0xffffffffffffff6c,lVar11);
        if (_Var4) {
          if (cavern_area == L'\0') {
            uncreate_artifacts((chunk_conflict *)c_00);
            wipe_mon_list(c_00,p);
            cave_free((chunk_conflict *)c_00);
            *p_error = "random selection of entrance to the centre vault failed";
            return (chunk_conflict *)0x0;
          }
          break;
        }
      }
      pierce_outer_wall((chunk_conflict *)c_00,(loc)stack0xffffffffffffff6c);
      square_set_feat(c_00,stack0xffffffffffffff6c,FEAT_FLOOR);
    }
    bVar2 = c_00->height <= c_00->width;
    if (bVar2) {
      iVar7 = (uint)z_info->dungeon_hgt - c_00->height;
      upper_cavern_hgt = c_00->height;
      lower_cavern_hgt = c_00->width;
    }
    else {
      iVar7 = (uint)z_info->dungeon_hgt - c_00->width;
      upper_cavern_hgt = c_00->width;
      lower_cavern_hgt = c_00->height;
    }
    centre_cavern_wid = iVar7 / 2;
    centre_cavern_hgt = (wchar_t)!bVar2;
    wVar8 = ((uint)z_info->dungeon_hgt - centre_cavern_wid) - upper_cavern_hgt;
    source = cavern_chunk(p,centre_cavern_wid,lower_cavern_hgt,(connector *)0x0);
    source_00 = cavern_chunk(p,wVar8,lower_cavern_hgt,(connector *)0x0);
    w = ((uint)z_info->dungeon_wid - lower_cavern_hgt) / 2;
    w_00 = ((uint)z_info->dungeon_wid - w) - lower_cavern_hgt;
    source_01 = cavern_chunk(p,(uint)z_info->dungeon_hgt,w,(connector *)0x0);
    source_02 = cavern_chunk(p,(uint)z_info->dungeon_hgt,w_00,(connector *)0x0);
    if ((((source == (chunk_conflict *)0x0) || (source_00 == (chunk_conflict *)0x0)) ||
        (source_01 == (chunk_conflict *)0x0)) || (source_02 == (chunk_conflict *)0x0)) {
      if (source_02 != (chunk_conflict *)0x0) {
        uncreate_artifacts(source_02);
        cave_free(source_02);
      }
      if (source_01 != (chunk_conflict *)0x0) {
        uncreate_artifacts(source_01);
        cave_free(source_01);
      }
      if (source_00 != (chunk_conflict *)0x0) {
        uncreate_artifacts(source_00);
        cave_free(source_00);
      }
      if (source != (chunk_conflict *)0x0) {
        uncreate_artifacts(source);
        cave_free(source);
      }
      uncreate_artifacts((chunk_conflict *)c_00);
      wipe_mon_list(c_00,p);
      cave_free((chunk_conflict *)c_00);
      *p_error = "could not create one or more of the surrounding caverns";
      p_local = (player *)0x0;
    }
    else {
      p_local = (player *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
      *(int *)((long)&p_local->class + 4) = (int)p->depth;
      (p_local->grid).x = (int)p->place;
      chunk_copy((chunk_conflict *)p_local,p,source_01,L'\0',L'\0',L'\0',false);
      lVar11 = loc(0,0);
      lVar12 = loc(w + L'\xffffffff',z_info->dungeon_hgt - 1);
      find_empty_range((chunk_conflict *)p_local,(loc *)&floor[3].y,lVar11,lVar12);
      local_b8 = stack0xffffffffffffff6c;
      chunk_copy((chunk_conflict *)p_local,p,source,L'\0',w,L'\0',false);
      lVar11 = loc(w,0);
      lVar12 = loc(w + lower_cavern_hgt + -1,centre_cavern_wid + L'\xffffffff');
      find_empty_range((chunk_conflict *)p_local,(loc *)&floor[3].y,lVar11,lVar12);
      floor[0].x = floor[3].y;
      floor[0].y = wStack_90;
      chunk_copy((chunk_conflict *)p_local,p,(chunk_conflict *)c_00,centre_cavern_wid,w,
                 centre_cavern_hgt,false);
      chunk_copy((chunk_conflict *)p_local,p,source_00,centre_cavern_wid + upper_cavern_hgt,w,L'\0',
                 false);
      lVar11 = loc(w,centre_cavern_wid + upper_cavern_hgt);
      lVar12 = loc(w + lower_cavern_hgt + -1,z_info->dungeon_hgt - 1);
      find_empty_range((chunk_conflict *)p_local,(loc *)&floor[3].y,lVar11,lVar12);
      floor[2].x = floor[3].y;
      floor[2].y = wStack_90;
      chunk_copy((chunk_conflict *)p_local,p,source_02,L'\0',w + lower_cavern_hgt,L'\0',false);
      lVar11 = loc(w + lower_cavern_hgt,0);
      lVar12 = loc(z_info->dungeon_wid - 1,z_info->dungeon_hgt - 1);
      find_empty_range((chunk_conflict *)p_local,(loc *)&floor[3].y,lVar11,lVar12);
      floor[1].x = floor[3].y;
      floor[1].y = wStack_90;
      draw_rectangle((chunk_conflict *)p_local,L'\0',L'\0',*(wchar_t *)&p_local->ht + L'\xffffffff',
                     p_local->au + L'\xffffffff',FEAT_PERM,L'\0',true);
      connect_caverns((chunk_conflict *)p_local,(loc *)&local_b8);
      ensure_connectedness((chunk_conflict *)p_local,false);
      cave_free(source_01);
      cave_free(source);
      cave_free((chunk_conflict *)c_00);
      cave_free(source_00);
      cave_free(source_02);
      wVar3 = FEAT_MORE;
      uVar1 = z_info->dungeon_hgt;
      wVar9 = rand_range(1,3);
      alloc_stairs((chunk_conflict *)p_local,wVar3,wVar9,L'\0',false,(connector *)0x0);
      wVar3 = FEAT_LESS;
      wVar9 = rand_range(1,2);
      alloc_stairs((chunk_conflict *)p_local,wVar3,wVar9,L'\0',false,(connector *)0x0);
      if (*(wchar_t *)((long)&p_local->class + 4) / 3 < 0xb) {
        local_14c = *(wchar_t *)((long)&p_local->class + 4) / 3;
      }
      else {
        local_14c = 10;
      }
      if (local_14c < 2) {
        local_150 = 2;
      }
      else {
        if (*(wchar_t *)((long)&p_local->class + 4) / 3 < 0xb) {
          local_154 = *(wchar_t *)((long)&p_local->class + 4) / 3;
        }
        else {
          local_154 = 10;
        }
        local_150 = local_154;
      }
      uVar6 = (local_150 *
              ((w + w_00) * (uint)uVar1 + lower_cavern_hgt * (centre_cavern_wid + wVar8))) /
              (int)((uint)z_info->dungeon_hgt * (uint)z_info->dungeon_wid);
      uVar10 = Rand_div(uVar6);
      alloc_objects((chunk_conflict *)p_local,L'\x03',L'\0',uVar10 + L'\x01',
                    *(wchar_t *)((long)&p_local->class + 4),'\0');
      uVar10 = Rand_div(uVar6);
      alloc_objects((chunk_conflict *)p_local,L'\x01',L'\x01',uVar10 + L'\x01',
                    *(wchar_t *)((long)&p_local->class + 4),'\0');
      _Var4 = new_player_spot((chunk_conflict *)p_local,p);
      if (_Var4) {
        uVar10 = Rand_div(8);
        for (cavern_area = uVar10 + 1 + uVar6; L'\0' < cavern_area;
            cavern_area = cavern_area + L'\xffffffff') {
          to_avoid.x = (p->grid).x;
          to_avoid.y = (p->grid).y;
          pick_and_place_distant_monster
                    ((chunk *)p_local,to_avoid,L'\0',true,*(wchar_t *)((long)&p_local->class + 4));
        }
        iVar5 = Rand_normal(uVar6,2);
        alloc_objects((chunk_conflict *)p_local,L'\x03',L'\x03',(int)iVar5,
                      *(wchar_t *)((long)&p_local->class + 4) + L'\x05','\a');
        iVar5 = Rand_normal((int)uVar6 / 2,2);
        alloc_objects((chunk_conflict *)p_local,L'\x03',L'\x02',(int)iVar5,
                      *(wchar_t *)((long)&p_local->class + 4),'\a');
        wVar8 = Rand_div((int)uVar6 / 4);
        alloc_objects((chunk_conflict *)p_local,L'\x03',L'\x04',wVar8,
                      *(wchar_t *)((long)&p_local->class + 4),'\a');
      }
      else {
        uncreate_artifacts((chunk_conflict *)p_local);
        wipe_mon_list((chunk *)p_local,p);
        cave_free((chunk_conflict *)p_local);
        *p_error = "could not place player";
        p_local = (player *)0x0;
      }
    }
  }
  else {
    uncreate_artifacts((chunk_conflict *)c_00);
    wipe_mon_list(c_00,p);
    cave_free((chunk_conflict *)c_00);
    *p_error = "no hard centre levels in persistent dungeons";
    p_local = (player *)0x0;
  }
  return (chunk_conflict *)p_local;
}

Assistant:

struct chunk *hard_centre_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	/* Make a vault for the centre */
	struct chunk *centre = vault_chunk(p);
	int rotate = 0;

	/* Dimensions for the surrounding caverns */
	int centre_cavern_ypos;
	int centre_cavern_hgt, centre_cavern_wid;
	int upper_cavern_hgt, lower_cavern_hgt;
	struct chunk *upper_cavern;
	struct chunk *lower_cavern;
	int lower_cavern_ypos;
	int left_cavern_wid, right_cavern_wid;
	struct chunk *left_cavern;
	struct chunk *right_cavern;
	struct chunk *c;
	int i, k, cavern_area;
	struct loc grid;
	struct loc floor[4];

	/* No persistent levels of this type for now */
	if (dun->persist) {
		uncreate_artifacts(centre);
		wipe_mon_list(centre, p);
		cave_free(centre);
		*p_error = "no hard centre levels in persistent dungeons";
		return NULL;
	}

	/*
	 * Carve out entrances to the vault.  Only use one if there aren't
	 * explicitly marked entrances since those vaults typically have empty
	 * space about them and the extra entrances aren't useful.
	 */
	k = 1 + ((dun->ent_n[0] > 0) ? randint1(3) : 0);
	dun->wall_n = 0;
	for (i = 0; i < k; ++i) {
		if (dun->ent_n[0] == 0) {
			/*
			 * There's no explicitly marked entrances.  Look for a
			 * square marked SQUARE_WALL_OUTER.
			 */
			if (!cave_find(centre, &grid, square_iswall_outer)) {
				if (i == 0) {
					uncreate_artifacts(centre);
					wipe_mon_list(centre, p);
					cave_free(centre);
					*p_error = "no SQUARE_WALL_OUTER grid for an entrance to the centre vault";
					return NULL;
				}
				break;
			}
		} else {
			grid = choose_random_entrance(centre, 0, NULL, 0,
				dun->wall, i);
			if (loc_eq(grid, loc(0, 0))) {
				if (i == 0) {
					uncreate_artifacts(centre);
					wipe_mon_list(centre, p);
					cave_free(centre);
					*p_error = "random selection of entrance to the centre vault failed";
					return NULL;
				}
				break;
			}
		}
		/*
		 * Store position in dun->wall and mark neighbors as invalid
		 * entrances.
		 */
		pierce_outer_wall(centre, grid);
		/* Convert it to a floor. */
		square_set_feat(centre, grid, FEAT_FLOOR);
	}

	/* Measure the vault, rotate to make it wider than it is high */
	if (centre->height > centre->width) {
		rotate = 1;
		centre_cavern_ypos = (z_info->dungeon_hgt - centre->width) / 2;
		centre_cavern_hgt = centre->width;
		centre_cavern_wid = centre->height;
	} else {
		centre_cavern_ypos = (z_info->dungeon_hgt - centre->height) / 2;
		centre_cavern_hgt = centre->height;
		centre_cavern_wid = centre->width;
	}
	upper_cavern_hgt = centre_cavern_ypos;
	lower_cavern_hgt = z_info->dungeon_hgt - upper_cavern_hgt -
		centre_cavern_hgt;
	lower_cavern_ypos = centre_cavern_ypos + centre_cavern_hgt;

	/* Make the caverns */
	upper_cavern = cavern_chunk(p, upper_cavern_hgt, centre_cavern_wid, NULL);
	lower_cavern = cavern_chunk(p, lower_cavern_hgt, centre_cavern_wid, NULL);
	left_cavern_wid = (z_info->dungeon_wid - centre_cavern_wid) / 2;
	right_cavern_wid = z_info->dungeon_wid - left_cavern_wid -
		centre_cavern_wid;
	left_cavern = cavern_chunk(p, z_info->dungeon_hgt, left_cavern_wid, NULL);
	right_cavern = cavern_chunk(p, z_info->dungeon_hgt, right_cavern_wid, NULL);

	/* Return on failure */
	if (!upper_cavern || !lower_cavern || !left_cavern || !right_cavern) {
		if (right_cavern) {
			uncreate_artifacts(right_cavern);
			cave_free(right_cavern);
		}
		if (left_cavern) {
			uncreate_artifacts(left_cavern);
			cave_free(left_cavern);
		}
		if (lower_cavern) {
			uncreate_artifacts(lower_cavern);
			cave_free(lower_cavern);
		}
		if (upper_cavern) {
			uncreate_artifacts(upper_cavern);
			cave_free(upper_cavern);
		}
		uncreate_artifacts(centre);
		wipe_mon_list(centre, p);
		cave_free(centre);
		*p_error = "could not create one or more of the surrounding caverns";
		return NULL;
	}

	/* Make a cave to copy them into, and find a floor square in each cavern */
	c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = p->place;

	/* Left */
	chunk_copy(c, p, left_cavern, 0, 0, 0, false);
	find_empty_range(c, &grid, loc(0, 0),
					 loc(left_cavern_wid - 1, z_info->dungeon_hgt - 1));
	floor[0] = grid;

	/* Upper */
	chunk_copy(c, p, upper_cavern, 0, left_cavern_wid, 0, false);
	find_empty_range(c, &grid, loc(left_cavern_wid, 0),
					 loc(left_cavern_wid + centre_cavern_wid - 1,
						 upper_cavern_hgt - 1));
	floor[1] = grid;

	/* Centre */
	chunk_copy(c, p, centre, centre_cavern_ypos, left_cavern_wid, rotate, false);

	/* Lower */
	chunk_copy(c, p, lower_cavern, lower_cavern_ypos, left_cavern_wid, 0, false);
	find_empty_range(c, &grid, loc(left_cavern_wid, lower_cavern_ypos),
					 loc(left_cavern_wid + centre_cavern_wid - 1,
						 z_info->dungeon_hgt - 1));
	floor[3] = grid;

	/* Right */
	chunk_copy(c, p, right_cavern, 0, left_cavern_wid + centre_cavern_wid, 0,
		false);
	find_empty_range(c, &grid, loc(left_cavern_wid + centre_cavern_wid, 0),
		loc(z_info->dungeon_wid - 1, z_info->dungeon_hgt - 1));
	floor[2] = grid;

	/* Encase in perma-rock */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_PERM, SQUARE_NONE, true);

	/* Connect up all the caverns */
	connect_caverns(c, floor);

	/* Connect to the centre entrances. */
	ensure_connectedness(c, false);

	/* Free all the chunks */
	cave_free(left_cavern);
	cave_free(upper_cavern);
	cave_free(centre);
	cave_free(lower_cavern);
	cave_free(right_cavern);

	cavern_area = (left_cavern_wid + right_cavern_wid) * z_info->dungeon_hgt +
		centre_cavern_wid * (upper_cavern_hgt + lower_cavern_hgt);

	/* Place 2-3 down stairs near some walls */
	alloc_stairs(c, FEAT_MORE, rand_range(1, 3), 0, false, NULL);

	/* Place 1-2 up stairs near some walls */
	alloc_stairs(c, FEAT_LESS, rand_range(1, 2), 0, false, NULL);

	/* Generate some rubble, traps and monsters */
	k = MAX(MIN(c->depth / 3, 10), 2);

	/* Scale number by total cavern size - caverns are fairly sparse */
	k = (k * cavern_area) / (z_info->dungeon_hgt * z_info->dungeon_wid);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_BOTH, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k), c->depth, 0);

	/* Determine the character location */
	if (!new_player_spot(c, p)) {
		uncreate_artifacts(c);
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "could not place player";
		return NULL;
	}

	/* Put some monsters in the dungeon */
	for (i = randint1(8) + k; i > 0; i--) {
		pick_and_place_distant_monster(c, p->grid, 0, true, c->depth);
	}

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT, Rand_normal(k, 2), c->depth + 5,
		ORIGIN_CAVERN);
	alloc_objects(c, SET_BOTH, TYP_GOLD, Rand_normal(k / 2, 2), c->depth,
		ORIGIN_CAVERN);
	alloc_objects(c, SET_BOTH, TYP_GOOD, randint0(k / 4), c->depth,
		ORIGIN_CAVERN);

	return c;
}